

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bork.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 extraout_RAX;
  allocator local_29;
  string local_28;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_28,argv[1],&local_29);
    from_file(&local_28);
  }
  else {
    if (argc != 3) {
      if (argc != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "SPECIFY 1 FILENAME TO INTERPRET. OR SPECIFY NONE TO START REPL.",0x3f);
        return 1;
      }
      repl();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    }
    std::__cxx11::string::string((string *)&local_28,argv[1],&local_29);
    pretty_print(&local_28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

  if (argc==1)
    repl();

  else if (argc==2) {
    from_file(std::string(argv[1]));
  } else if (argc==3) {

    pretty_print(argv[1]);

  } else {
    std::cerr << "SPECIFY 1 FILENAME TO INTERPRET. OR SPECIFY NONE TO START REPL.";
    return 1;
  }

  return 0;

}